

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O0

TokenizerW * tok_winit(wchar_t *ifs)

{
  wchar_t *pwVar1;
  void *pvVar2;
  wchar_t *local_28;
  TokenizerW *tok;
  wchar_t *ifs_local;
  
  ifs_local = (wchar_t *)malloc(0x48);
  if (ifs_local == (wchar_t *)0x0) {
    ifs_local = (wchar_t *)0x0;
  }
  else {
    local_28 = ifs;
    if (ifs == (wchar_t *)0x0) {
      local_28 = anon_var_dwarf_12163;
    }
    pwVar1 = wcsdup(local_28);
    *(wchar_t **)ifs_local = pwVar1;
    if (*(long *)ifs_local == 0) {
      free(ifs_local);
      ifs_local = (wchar_t *)0x0;
    }
    else {
      ifs_local[2] = L'\0';
      ifs_local[3] = L'\0';
      ifs_local[4] = L'\n';
      ifs_local[5] = L'\0';
      pvVar2 = malloc(*(long *)(ifs_local + 4) << 3);
      *(void **)(ifs_local + 6) = pvVar2;
      if (*(long *)(ifs_local + 6) == 0) {
        free(*(void **)ifs_local);
        free(ifs_local);
        ifs_local = (wchar_t *)0x0;
      }
      else {
        **(undefined8 **)(ifs_local + 6) = 0;
        pvVar2 = malloc(0x50);
        *(void **)(ifs_local + 0xe) = pvVar2;
        if (*(long *)(ifs_local + 0xe) == 0) {
          free(*(void **)(ifs_local + 6));
          free(*(void **)ifs_local);
          free(ifs_local);
          ifs_local = (wchar_t *)0x0;
        }
        else {
          *(long *)(ifs_local + 10) = *(long *)(ifs_local + 0xe) + 0x50;
          *(long *)(ifs_local + 0xc) = *(long *)(ifs_local + 0xe);
          *(long *)(ifs_local + 8) = *(long *)(ifs_local + 0xe);
          ifs_local[0x11] = L'\0';
          ifs_local[0x10] = L'\0';
        }
      }
    }
  }
  return (TokenizerW *)ifs_local;
}

Assistant:

TYPE(Tokenizer) *
FUN(tok,init)(const Char *ifs)
{
	TYPE(Tokenizer) *tok = tok_malloc(sizeof(*tok));

	if (tok == NULL)
		return NULL;
	tok->ifs = tok_strdup(ifs ? ifs : IFS);
	if (tok->ifs == NULL) {
		tok_free(tok);
		return NULL;
	}
	tok->argc = 0;
	tok->amax = AINCR;
	tok->argv = tok_malloc(sizeof(*tok->argv) * tok->amax);
	if (tok->argv == NULL) {
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->argv[0] = NULL;
	tok->wspace = tok_malloc(WINCR * sizeof(*tok->wspace));
	if (tok->wspace == NULL) {
		tok_free(tok->argv);
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->wmax = tok->wspace + WINCR;
	tok->wstart = tok->wspace;
	tok->wptr = tok->wspace;
	tok->flags = 0;
	tok->quote = Q_none;

	return tok;
}